

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_30::AsyncStreamFd::whenWriteDisconnected(AsyncStreamFd *this)

{
  long *plVar1;
  _func_int **pp_Var2;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar4;
  undefined1 local_38 [8];
  _func_int **pp_Stack_30;
  Promise<void> local_28;
  PromiseNode *pPVar3;
  
  if (*(char *)(in_RSI + 0x78) == '\x01') {
    PVar4 = _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
    pPVar3 = PVar4.super_PromiseBase.node.ptr;
  }
  else {
    UnixEventPort::FdObserver::whenWriteDisconnected((FdObserver *)local_38);
    Promise<void>::fork(&local_28);
    pp_Var2 = pp_Stack_30;
    if (pp_Stack_30 != (_func_int **)0x0) {
      pp_Stack_30 = (_func_int **)0x0;
      (**(code **)*(_func_int **)local_38)(local_38,(long)pp_Var2 + *(long *)(*pp_Var2 + -0x10));
    }
    PVar4 = _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_38);
    pPVar3 = PVar4.super_PromiseBase.node.ptr;
    if (*(char *)(in_RSI + 0x78) == '\x01') {
      *(undefined1 *)(in_RSI + 0x78) = 0;
      plVar1 = *(long **)(in_RSI + 0x88);
      if (plVar1 != (long *)0x0) {
        *(undefined8 *)(in_RSI + 0x88) = 0;
        (**(code **)**(undefined8 **)(in_RSI + 0x80))
                  (*(undefined8 **)(in_RSI + 0x80),(long)plVar1 + *(long *)(*plVar1 + -0x10));
        pPVar3 = extraout_RDX;
      }
    }
    *(Disposer **)(in_RSI + 0x80) = local_28.super_PromiseBase.node.disposer;
    *(PromiseNode **)(in_RSI + 0x88) = local_28.super_PromiseBase.node.ptr;
    *(undefined1 *)(in_RSI + 0x78) = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
    _vptr_AsyncInputStream = (_func_int **)local_38;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = pp_Stack_30;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

Promise<void> whenWriteDisconnected() override {
    KJ_IF_MAYBE(p, writeDisconnectedPromise) {
      return p->addBranch();
    } else {
      auto fork = observer.whenWriteDisconnected().fork();
      auto result = fork.addBranch();
      writeDisconnectedPromise = kj::mv(fork);
      return kj::mv(result);
    }